

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug __thiscall
QtPrivate::
printSequentialContainer<std::vector<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>,std::allocator<std::unique_ptr<QIconLoaderEngineEntry,std::default_delete<QIconLoaderEngineEntry>>>>>
          (QtPrivate *this,QDebug debug,char *which,
          vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
          *c)

{
  char16_t **ppcVar1;
  char *pcVar2;
  pointer puVar3;
  storage_type *psVar4;
  storage_type *psVar5;
  _Head_base<0UL,_QIconLoaderEngineEntry_*,_false> this_00;
  QTextStream *pQVar6;
  pointer puVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QDebugStateSaver saver;
  __uniq_ptr_impl<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> local_78;
  undefined1 local_70 [8];
  _Head_base<0UL,_QIconLoaderEngineEntry_*,_false> local_68;
  undefined1 local_60 [8];
  undefined1 *local_58;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_58,(QDebug *)debug.stream);
  pQVar6 = *(QTextStream **)debug.stream;
  pQVar6[0x30] = (QTextStream)0x0;
  if (which == (char *)0x0) {
    psVar5 = (storage_type *)0x0;
  }
  else {
    psVar4 = (storage_type *)0xffffffffffffffff;
    do {
      psVar5 = psVar4 + 1;
      pcVar2 = which + 1 + (long)psVar4;
      psVar4 = psVar5;
    } while (*pcVar2 != '\0');
  }
  QVar8.m_data = psVar5;
  QVar8.m_size = (qsizetype)local_50;
  QString::fromUtf8(QVar8);
  QTextStream::operator<<(pQVar6,(QString *)local_50);
  if (local_50[0] != (QArrayData *)0x0) {
    LOCK();
    (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50[0],2,0x10);
    }
  }
  pQVar6 = *(QTextStream **)debug.stream;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)debug.stream;
  }
  QTextStream::operator<<(pQVar6,'(');
  if ((*(QTextStream **)debug.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(*(QTextStream **)debug.stream,' ');
  }
  puVar7 = (c->
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (c->
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar3) {
    local_68._M_head_impl = *(QIconLoaderEngineEntry **)debug.stream;
    ppcVar1 = &((local_68._M_head_impl)->dir).path.d.ptr;
    *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
    ::operator<<((Stream *)local_60,
                 (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_> *
                 )&local_68);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug((QDebug *)&local_68);
    puVar7 = puVar7 + 1;
  }
  if (puVar7 != puVar3) {
    do {
      pQVar6 = *(QTextStream **)debug.stream;
      QVar9.m_data = (storage_type *)0x2;
      QVar9.m_size = (qsizetype)local_50;
      QString::fromUtf8(QVar9);
      QTextStream::operator<<(pQVar6,(QString *)local_50);
      if (local_50[0] != (QArrayData *)0x0) {
        LOCK();
        (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50[0],2,0x10);
        }
      }
      this_00._M_head_impl = *(QIconLoaderEngineEntry **)debug.stream;
      if (*(QTextStream *)((long)this_00._M_head_impl + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)this_00._M_head_impl,' ');
        this_00._M_head_impl = *(QIconLoaderEngineEntry **)debug.stream;
      }
      ppcVar1 = &((this_00._M_head_impl)->dir).path.d.ptr;
      *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
      local_78._M_t.
      super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
      .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl =
           (tuple<QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>)
           (tuple<QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>)
           this_00._M_head_impl;
      ::operator<<((Stream *)local_70,
                   (unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                    *)&local_78);
      QDebug::~QDebug((QDebug *)local_70);
      QDebug::~QDebug((QDebug *)&local_78);
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar3);
  }
  QTextStream::operator<<(*(QTextStream **)debug.stream,')');
  pQVar6 = *(QTextStream **)debug.stream;
  if (pQVar6[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar6,' ');
    pQVar6 = *(QTextStream **)debug.stream;
  }
  *(undefined8 *)debug.stream = 0;
  *(QTextStream **)this = pQVar6;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QDebug)(Stream *)this;
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}